

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void qSendWindowChangeToTextureChildrenRecursively(QWidget *widget,Type eventType)

{
  long lVar1;
  QWidget *widget_00;
  ulong uVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&widget->field_0x8;
  if ((*(byte *)(lVar1 + 0x253) & 1) != 0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,eventType);
    QCoreApplication::sendEvent(&widget->super_QObject,(QEvent *)&local_38);
    QEvent::~QEvent((QEvent *)&local_38);
  }
  if (*(long *)(lVar1 + 0x28) != 0) {
    uVar2 = 0;
    do {
      widget_00 = *(QWidget **)(*(long *)(lVar1 + 0x20) + uVar2 * 8);
      if ((widget_00 == (QWidget *)0x0) ||
         ((*(byte *)(*(long *)&widget_00->field_0x8 + 0x30) & 1) == 0)) {
        widget_00 = (QWidget *)0x0;
      }
      if ((widget_00 != (QWidget *)0x0) &&
         (((widget_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
        qSendWindowChangeToTextureChildrenRecursively(widget_00,eventType);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ulong *)(lVar1 + 0x28));
  }
  if (*(long *)(lVar1 + 0x78) == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = *(long *)(*(long *)(lVar1 + 0x78) + 8);
  }
  if (lVar1 == 0) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = *(QObject **)(lVar1 + 0x20);
  }
  if (pQVar3 != (QObject *)0x0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,eventType);
    QCoreApplication::sendEvent(pQVar3,(QEvent *)&local_38);
    QEvent::~QEvent((QEvent *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qSendWindowChangeToTextureChildrenRecursively(QWidget *widget, QEvent::Type eventType)
{
    QWidgetPrivate *d = QWidgetPrivate::get(widget);
    if (d->renderToTexture) {
        QEvent e(eventType);
        QCoreApplication::sendEvent(widget, &e);
    }

    for (int i = 0; i < d->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
        if (w && !w->isWindow())
            qSendWindowChangeToTextureChildrenRecursively(w, eventType);
    }

    // Notify QWidgetWindow after we've notified all child QWidgets
    if (auto *window = d->windowHandle(QWidgetPrivate::WindowHandleMode::Direct)) {
        QEvent e(eventType);
        QCoreApplication::sendEvent(window, &e);
    }
}